

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_nnquant.c
# Opt level: O2

void initnet(nn_quant *nnq,uchar *thepic,int len,int sample,int colours)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  int *piVar4;
  nq_pixel *__s;
  
  __s = nnq->network;
  uVar3 = 0;
  memset(__s,0,0x1400);
  nnq->thepicture = thepic;
  nnq->lengthcount = len;
  nnq->samplefac = sample;
  nnq->netsize = colours;
  piVar4 = nnq->freq;
  uVar2 = 0;
  if (0 < colours) {
    uVar2 = (ulong)(uint)colours;
  }
  for (; uVar2 * 0x1000 != uVar3; uVar3 = uVar3 + 0x1000) {
    iVar1 = (int)((long)((ulong)(uint)((int)uVar3 >> 0x1f) << 0x20 | uVar3 & 0xffffffff) /
                 (long)colours);
    (*__s)[0] = iVar1;
    (*__s)[1] = iVar1;
    (*__s)[2] = iVar1;
    (*__s)[3] = iVar1;
    *piVar4 = (int)(0x10000 / (long)colours);
    piVar4[-0x100] = 0;
    piVar4 = piVar4 + 1;
    __s = __s + 1;
  }
  return;
}

Assistant:

void initnet(nnq, thepic, len, sample, colours)
nn_quant *nnq;
unsigned char *thepic;
int len;
int sample;
int colours;
{
	register int i;
	register int *p;

	/* Clear out network from previous runs */
	/* thanks to Chen Bin for this fix */
	memset((void*)nnq->network, 0, sizeof(nq_pixel)*MAXNETSIZE);

	nnq->thepicture = thepic;
	nnq->lengthcount = len;
	nnq->samplefac = sample;
	nnq->netsize = colours;

	for (i=0; i < nnq->netsize; i++) {
		p = nnq->network[i];
		p[0] = p[1] = p[2] = p[3] = (i << (netbiasshift+8)) / nnq->netsize;
		nnq->freq[i] = intbias / nnq->netsize;	/* 1/netsize */
		nnq->bias[i] = 0;
	}
}